

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSharedData.cpp
# Opt level: O1

cl_mem __thiscall
xmrig::OclSharedData::createBuffer
          (OclSharedData *this,cl_context context,size_t size,size_t *offset)

{
  int iVar1;
  cl_mem p_Var2;
  size_t sVar3;
  ulong uVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar1 == 0) {
    sVar3 = this->m_offset;
    this->m_offset = sVar3 + 1;
    *offset = *offset + sVar3 * size;
    if (this->m_buffer == (cl_mem)0x0) {
      uVar4 = size * this->m_threads;
      sVar3 = 0x40000000;
      if (0x40000000 < uVar4) {
        sVar3 = uVar4;
      }
      p_Var2 = OclLib::createBuffer(context,1,sVar3,(void *)0x0);
      this->m_buffer = p_Var2;
    }
    p_Var2 = OclLib::retain(this->m_buffer);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    return p_Var2;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

cl_mem xmrig::OclSharedData::createBuffer(cl_context context, size_t size, size_t &offset)
{
    std::lock_guard<std::mutex> lock(m_mutex);

    offset += size * m_offset++;
    size   = std::max(size * m_threads, oneGiB);

    if (!m_buffer) {
        m_buffer = OclLib::createBuffer(context, CL_MEM_READ_WRITE, size);
    }

    return OclLib::retain(m_buffer);
}